

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::OnStateChange(CGameClient *this,int NewState,int OldState)

{
  CComponent *pCVar1;
  long lVar2;
  
  if (NewState < 3) {
    OnReset(this);
  }
  if (0 < (this->m_All).m_Num) {
    lVar2 = 0;
    do {
      pCVar1 = (this->m_All).m_paComponents[lVar2];
      (*pCVar1->_vptr_CComponent[2])(pCVar1,NewState,(ulong)(uint)OldState);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_All).m_Num);
  }
  return;
}

Assistant:

void CGameClient::OnStateChange(int NewState, int OldState)
{
	// reset everything when not already connected (to keep gathered stuff)
	if(NewState < IClient::STATE_ONLINE)
		OnReset();

	// then change the state
	for(int i = 0; i < m_All.m_Num; i++)
		m_All.m_paComponents[i]->OnStateChange(NewState, OldState);
}